

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::util_reportSolverProgress(HModel *this)

{
  uint uVar1;
  pointer pcVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if (this->intOption[0] == 0) {
    return;
  }
  dVar3 = HTimer::getTime(&this->timer);
  if (dVar3 < util_reportSolverProgress::nextReport) {
    return;
  }
  computeDuObj(this,2);
  pcVar2 = (this->modelName)._M_dataplus._M_p;
  dVar5 = this->objective;
  uVar1 = this->numberIteration;
  dVar4 = HTimer::getTime(&this->timer);
  printf("PROGRESS %16s %20.10e %10d %10.3f\n",SUB84(dVar5,0),dVar4,pcVar2,(ulong)uVar1);
  if (50.0 <= dVar3) {
    if (dVar3 < 500.0) {
      dVar5 = (double)(int)(dVar3 + 1.0);
      goto LAB_001345c2;
    }
    dVar5 = 0.2;
  }
  else {
    dVar5 = 5.0;
  }
  dVar5 = (double)(int)(dVar3 * dVar5 + 1.0) / dVar5;
LAB_001345c2:
  util_reportSolverProgress::nextReport = dVar5 + -1e-05;
  return;
}

Assistant:

void HModel::util_reportSolverProgress() {
  if (!intOption[INTOPT_PRINT_FLAG]) return;
  static double nextReport = 0;
  double currentTime = timer.getTime();
  if (currentTime >= nextReport) {
    computeDuObj();
    printf("PROGRESS %16s %20.10e %10d %10.3f\n", modelName.c_str(),
	   objective, numberIteration, timer.getTime());
    if (currentTime < 50) {
      nextReport = ((int) (5 * currentTime + 1)) / 5.0 - 0.00001;
    } else if (currentTime < 500) {
      nextReport = ((int) (currentTime + 1)) - 0.00001;
    } else {
      nextReport = ((int) (0.2 * currentTime + 1)) / 0.2 - 0.00001;
    }
  }
}